

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChVariablesNode.cpp
# Opt level: O2

void __thiscall
chrono::ChVariablesNode::DiagonalAdd(ChVariablesNode *this,ChVectorRef *result,double c_a)

{
  double dVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  Scalar *pSVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  
  dVar1 = this->mass;
  pSVar5 = Eigen::
           DenseCoeffsBase<Eigen::Ref<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0,_Eigen::InnerStride<1>_>,_1>
           ::operator()((DenseCoeffsBase<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>,_1>
                         *)result,(long)(this->super_ChVariables).offset);
  auVar6._8_8_ = 0;
  auVar6._0_8_ = c_a;
  auVar9._8_8_ = 0;
  auVar9._0_8_ = dVar1;
  auVar2._8_8_ = 0;
  auVar2._0_8_ = *pSVar5;
  auVar2 = vfmadd213sd_fma(auVar9,auVar6,auVar2);
  *pSVar5 = auVar2._0_8_;
  dVar1 = this->mass;
  pSVar5 = Eigen::
           DenseCoeffsBase<Eigen::Ref<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0,_Eigen::InnerStride<1>_>,_1>
           ::operator()((DenseCoeffsBase<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>,_1>
                         *)result,(long)(this->super_ChVariables).offset + 1);
  auVar7._8_8_ = 0;
  auVar7._0_8_ = c_a;
  auVar10._8_8_ = 0;
  auVar10._0_8_ = dVar1;
  auVar3._8_8_ = 0;
  auVar3._0_8_ = *pSVar5;
  auVar2 = vfmadd213sd_fma(auVar10,auVar7,auVar3);
  *pSVar5 = auVar2._0_8_;
  dVar1 = this->mass;
  pSVar5 = Eigen::
           DenseCoeffsBase<Eigen::Ref<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0,_Eigen::InnerStride<1>_>,_1>
           ::operator()((DenseCoeffsBase<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>,_1>
                         *)result,(long)(this->super_ChVariables).offset + 2);
  auVar8._8_8_ = 0;
  auVar8._0_8_ = c_a;
  auVar11._8_8_ = 0;
  auVar11._0_8_ = dVar1;
  auVar4._8_8_ = 0;
  auVar4._0_8_ = *pSVar5;
  auVar2 = vfmadd213sd_fma(auVar11,auVar8,auVar4);
  *pSVar5 = auVar2._0_8_;
  return;
}

Assistant:

void ChVariablesNode::DiagonalAdd(ChVectorRef result, const double c_a) const {
    result(this->offset) += c_a * mass;
    result(this->offset + 1) += c_a * mass;
    result(this->offset + 2) += c_a * mass;
}